

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGenerators::ChecksumedPath
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,string *sourceFile,
          string *basePrefix,string *baseSuffix)

{
  string local_40;
  
  cmFilePathChecksum::getPart(__return_storage_ptr__,&this->FPathChecksum,sourceFile,10);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(basePrefix->_M_dataplus)._M_p);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_40,sourceFile);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(baseSuffix->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ChecksumedPath(
  const std::string& sourceFile, const std::string& basePrefix,
  const std::string& baseSuffix) const
{
  std::string res = FPathChecksum.getPart(sourceFile);
  res += "/";
  res += basePrefix;
  res += cmsys::SystemTools::GetFilenameWithoutLastExtension(sourceFile);
  res += baseSuffix;
  return res;
}